

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_TestShell::createTest
          (TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_TestShell *this)

{
  Utest *this_00;
  TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockStrictOrderTest.cpp"
                                  ,0x6c);
  TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test::
  TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test
            ((TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockStrictOrderTest, orderViolatedWorksWithExtraUnexpectedCall)
{
    MockFailureReporterInstaller failureReporterInstaller;
    mock().strictOrder();
    mock("bla").strictOrder();
	mock().ignoreOtherCalls();

    MockExpectedCallsListForTest expectations;
    expectations.addFunctionOrdered("foo::foo1", 1)->callWasMade(2);
    expectations.addFunctionOrdered("foo::foo2", 2)->callWasMade(1);
    MockCallOrderFailure expectedFailure(mockFailureTest(), expectations);

    mock("bla").expectOneCall("foo1");
    mock("foo").expectOneCall("foo1");
    mock("foo").expectOneCall("foo2");

    mock("bla").actualCall("foo1");
    mock("foo").actualCall("foo2");
	mock("foo").actualCall("unexpected1");
    mock("foo").actualCall("foo1");
	mock("foo").actualCall("unexpected2");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}